

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall mpt::reference<mpt::layout::line>::type::type(type *this,uintptr_t initial)

{
  (this->super_line).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_00147c68;
  (this->super_line).super_object._vptr_object = (_func_int **)&PTR___cxa_pure_virtual_00148848;
  (this->super_line).super_line.color.alpha = 0xff;
  (this->super_line).super_line.color.red = '\0';
  (this->super_line).super_line.color.green = '\0';
  (this->super_line).super_line.color.blue = '\0';
  (this->super_line).super_line.attr.style = '\x01';
  (this->super_line).super_line.attr.width = '\x01';
  (this->super_line).super_line.attr.symbol = '\0';
  (this->super_line).super_line.attr.size = '\n';
  (this->super_line).super_line.from.super_point<float> = (point<float>)0x0;
  (this->super_line).super_line.to.super_point<float> = (point<float>)0x0;
  mpt_line_init(&(this->super_line).super_line);
  (this->super_line).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_00148b58;
  (this->super_line).super_object._vptr_object = (_func_int **)&PTR_property_00148ba8;
  (this->_ref)._val = initial;
  return;
}

Assistant:

type(uintptr_t initial = 1) : _ref(initial)
		{ }